

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O2

void __thiscall
VPLGrammar::Parser::ShiftExpressionNode::BuildProgram
          (ShiftExpressionNode *this,Scope *scope,ostream *out)

{
  pointer puVar1;
  __uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_> _Var2;
  int iVar3;
  char *pcVar4;
  size_t i;
  ulong uVar5;
  
  (**(code **)(*(long *)(((this->super_ASTNodeBasic).children_.
                          super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                        ._M_t + 0x28))();
  uVar5 = 2;
  do {
    puVar1 = (this->super_ASTNodeBasic).children_.
             super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->super_ASTNodeBasic).children_.
                      super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar5) {
      return;
    }
    _Var2._M_t.
    super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
    .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl =
         puVar1[uVar5]._M_t.
         super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
         ._M_t;
    (**(code **)(*(long *)_Var2._M_t.
                          super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                          .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl +
                0x28))(_Var2._M_t.
                       super__Tuple_impl<0UL,_VPLGrammar::ASTNodeBasic_*,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                       .super__Head_base<0UL,_VPLGrammar::ASTNodeBasic_*,_false>._M_head_impl,scope,
                       out);
    std::operator<<(out,"    ");
    iVar3 = (**(code **)(*(long *)(this->super_ASTNodeBasic).children_.
                                  super__Vector_base<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5 - 1]._M_t.
                                  super___uniq_ptr_impl<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>
                                  ._M_t + 0x10))();
    pcVar4 = "    shl\n";
    if (iVar3 == 0x34) {
LAB_0011ee27:
      std::operator<<(out,pcVar4);
    }
    else if (iVar3 == 0x35) {
      pcVar4 = "    shr\n";
      goto LAB_0011ee27;
    }
    std::operator<<(out,'\n');
    scope->cur_stack_pos_ = scope->cur_stack_pos_ + -1;
    uVar5 = uVar5 + 2;
  } while( true );
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                children_[0]->BuildProgram(scope, out);
                for (size_t i = 2; i < children_.size(); i += 2) {
                    children_[i]->BuildProgram(scope, out);
                    out << "    ";
                    switch(children_[i - 1]->GetType()) {
                        case kShiftLeftType:
                            out << "    shl\n";
                            break;
                        case kShiftRightType:
                            out << "    shr\n";
                            break;
                    }
                    out << '\n';
                    scope->Pop();
                }
            }